

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

Token * __thiscall
wabt::WastLexer::GetNumberToken(Token *__return_storage_ptr__,WastLexer *this,TokenType token_type)

{
  bool bVar1;
  int c;
  TokenType local_14;
  TokenType token_type_local;
  WastLexer *this_local;
  
  bVar1 = ReadNum(this);
  if (bVar1) {
    bVar1 = MatchChar(this,'.');
    local_14 = token_type;
    if (bVar1) {
      local_14 = First_Literal;
      c = PeekChar(this);
      bVar1 = IsDigit(c);
      if ((bVar1) && (bVar1 = ReadNum(this), !bVar1)) {
        GetReservedToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
    }
    bVar1 = MatchChar(this,'e');
    if ((bVar1) || (bVar1 = MatchChar(this,'E'), bVar1)) {
      local_14 = First_Literal;
      ReadSign(this);
      bVar1 = ReadNum(this);
      if (!bVar1) {
        GetReservedToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
    }
    bVar1 = NoTrailingReservedChars(this);
    if (bVar1) {
      if (local_14 == First_Literal) {
        LiteralToken(__return_storage_ptr__,this,First_Literal,Float);
        return __return_storage_ptr__;
      }
      LiteralToken(__return_storage_ptr__,this,local_14,Int);
      return __return_storage_ptr__;
    }
  }
  GetReservedToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetNumberToken(TokenType token_type) {
  if (ReadNum()) {
    if (MatchChar('.')) {
      token_type = TokenType::Float;
      if (IsDigit(PeekChar()) && !ReadNum()) {
        return GetReservedToken();
      }
    }
    if (MatchChar('e') || MatchChar('E')) {
      token_type = TokenType::Float;
      ReadSign();
      if (!ReadNum()) {
        return GetReservedToken();
      }
    }
    if (NoTrailingReservedChars()) {
      if (token_type == TokenType::Float) {
        return LiteralToken(token_type, LiteralType::Float);
      } else {
        return LiteralToken(token_type, LiteralType::Int);
      }
    }
  }
  return GetReservedToken();
}